

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void * NULLC::GetBasePointer(void *ptr)

{
  uint *puVar1;
  uint *puVar2;
  iterator pnVar3;
  Range local_18;
  
  puVar2 = (uint *)ObjectBlockPool<8,_8192>::GetBasePointer((ObjectBlockPool<8,_8192> *)pool8,ptr);
  if (puVar2 == (uint *)0x0) {
    puVar2 = (uint *)ObjectBlockPool<16,_4096>::GetBasePointer
                               ((ObjectBlockPool<16,_4096> *)pool16,ptr);
    if (puVar2 == (uint *)0x0) {
      puVar2 = (uint *)ObjectBlockPool<32,_2048>::GetBasePointer
                                 ((ObjectBlockPool<32,_2048> *)pool32,ptr);
      if (puVar2 == (uint *)0x0) {
        puVar2 = (uint *)ObjectBlockPool<64,_1024>::GetBasePointer
                                   ((ObjectBlockPool<64,_1024> *)pool64,ptr);
        if (puVar2 == (uint *)0x0) {
          puVar2 = (uint *)ObjectBlockPool<128,_512>::GetBasePointer
                                     ((ObjectBlockPool<128,_512> *)pool128,ptr);
          if (puVar2 == (uint *)0x0) {
            puVar2 = (uint *)ObjectBlockPool<256,_256>::GetBasePointer
                                       ((ObjectBlockPool<256,_256> *)pool256,ptr);
            if (puVar2 == (uint *)0x0) {
              puVar2 = (uint *)ObjectBlockPool<512,_128>::GetBasePointer
                                         ((ObjectBlockPool<512,_128> *)pool512,ptr);
              if (puVar2 == (uint *)0x0) {
                local_18.start = ptr;
                local_18.end = ptr;
                pnVar3 = Tree<NULLC::Range>::find((Tree<NULLC::Range> *)bigBlocks,&local_18);
                if ((pnVar3 == (iterator)0x0) ||
                   (puVar1 = (uint *)(pnVar3->key).start, ptr < puVar1)) {
                  puVar2 = (uint *)0x0;
                }
                else {
                  puVar2 = (uint *)0x0;
                  if (ptr <= (void *)((ulong)*puVar1 + (long)puVar1)) {
                    puVar2 = puVar1 + 3;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return puVar2;
}

Assistant:

void* NULLC::GetBasePointer(void* ptr)
{
	// Search in range of every pool
	if(void *base = pool8.GetBasePointer(ptr))
		return base;
	if(void *base = pool16.GetBasePointer(ptr))
		return base;
	if(void *base = pool32.GetBasePointer(ptr))
		return base;
	if(void *base = pool64.GetBasePointer(ptr))
		return base;
	if(void *base = pool128.GetBasePointer(ptr))
		return base;
	if(void *base = pool256.GetBasePointer(ptr))
		return base;
	if(void *base = pool512.GetBasePointer(ptr))
		return base;

	// Search in global pool
	if(BigBlockIterator it = bigBlocks.find(Range(ptr, ptr)))
	{
		void *block = it->key.start;

		if(ptr >= block && ptr <= (char*)block + *(unsigned int*)block)
			return (char*)block + 4 + sizeof(markerType);
	}

	return NULL;
}